

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableBeginInitMemory(ImGuiTable *table,int columns_count)

{
  int iVar1;
  void *pvVar2;
  undefined1 local_40 [8];
  ImSpanAllocator<3> span_allocator;
  int columns_count_local;
  ImGuiTable *table_local;
  
  span_allocator.Sizes[2] = columns_count;
  ImSpanAllocator<3>::ImSpanAllocator((ImSpanAllocator<3> *)local_40);
  ImSpanAllocator<3>::Reserve
            ((ImSpanAllocator<3> *)local_40,0,(long)span_allocator.Sizes[2] * 0x68,4);
  ImSpanAllocator<3>::Reserve((ImSpanAllocator<3> *)local_40,1,(long)span_allocator.Sizes[2],4);
  ImSpanAllocator<3>::Reserve((ImSpanAllocator<3> *)local_40,2,(long)span_allocator.Sizes[2] << 3,4)
  ;
  iVar1 = ImSpanAllocator<3>::GetArenaSizeInBytes((ImSpanAllocator<3> *)local_40);
  pvVar2 = MemAlloc((long)iVar1);
  table->RawData = pvVar2;
  pvVar2 = table->RawData;
  iVar1 = ImSpanAllocator<3>::GetArenaSizeInBytes((ImSpanAllocator<3> *)local_40);
  memset(pvVar2,0,(long)iVar1);
  ImSpanAllocator<3>::SetArenaBasePtr((ImSpanAllocator<3> *)local_40,table->RawData);
  ImSpanAllocator<3>::GetSpan<ImGuiTableColumn>((ImSpanAllocator<3> *)local_40,0,&table->Columns);
  ImSpanAllocator<3>::GetSpan<signed_char>
            ((ImSpanAllocator<3> *)local_40,1,&table->DisplayOrderToIndex);
  ImSpanAllocator<3>::GetSpan<ImGuiTableCellData>
            ((ImSpanAllocator<3> *)local_40,2,&table->RowCellData);
  return;
}

Assistant:

void ImGui::TableBeginInitMemory(ImGuiTable* table, int columns_count)
{
    // Allocate single buffer for our arrays
    ImSpanAllocator<3> span_allocator;
    span_allocator.Reserve(0, columns_count * sizeof(ImGuiTableColumn));
    span_allocator.Reserve(1, columns_count * sizeof(ImGuiTableColumnIdx));
    span_allocator.Reserve(2, columns_count * sizeof(ImGuiTableCellData), 4);
    table->RawData = IM_ALLOC(span_allocator.GetArenaSizeInBytes());
    memset(table->RawData, 0, span_allocator.GetArenaSizeInBytes());
    span_allocator.SetArenaBasePtr(table->RawData);
    span_allocator.GetSpan(0, &table->Columns);
    span_allocator.GetSpan(1, &table->DisplayOrderToIndex);
    span_allocator.GetSpan(2, &table->RowCellData);
}